

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

void __thiscall
cfd::core::MerkleBlock::TraverseAndBuild
          (MerkleBlock *this,uint64_t height,uint64_t pos,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids,
          vector<bool,_std::allocator<bool>_> *matches)

{
  _Bit_type *p_Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t height_00;
  bool __x;
  vector<bool,_std::allocator<bool>_> local_a0;
  vector<bool,_std::allocator<bool>_> local_78;
  Txid local_50;
  
  uVar3 = pos << ((byte)height & 0x3f);
  uVar2 = pos + 1 << ((byte)height & 0x3f);
  if (this->transaction_count <= uVar2) {
    uVar2 = this->transaction_count;
  }
  __x = uVar3 < uVar2;
  if (__x) {
    p_Var1 = (matches->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    uVar4 = uVar3 + 0x3f;
    if (-1 < (long)uVar3) {
      uVar4 = uVar3;
    }
    if ((p_Var1[((long)uVar4 >> 6) +
                (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
         (uVar3 & 0x3f) & 1) == 0) {
      do {
        uVar4 = uVar3 + 1;
        if (uVar2 == uVar4) break;
        uVar5 = uVar3 + 0x40;
        if (-1 < (long)uVar4) {
          uVar5 = uVar4;
        }
        uVar3 = uVar4;
      } while ((p_Var1[((long)uVar5 >> 6) +
                       (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) +
                       0xffffffffffffffff] >> (uVar4 & 0x3f) & 1) == 0);
      __x = uVar4 < uVar2;
    }
  }
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)&this->bits_,__x);
  if ((height == 0) || (__x == false)) {
    CalculateHash(&local_50,this,height,pos,txids);
    ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::emplace_back<cfd::core::Txid>
              (&this->txids_,&local_50);
    local_50._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
    if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    height_00 = height - 1;
    ::std::vector<bool,_std::allocator<bool>_>::vector(&local_78,matches);
    TraverseAndBuild(this,height_00,pos * 2,txids,&local_78);
    if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    uVar2 = pos * 2 | 1;
    if (uVar2 < ~(-1L << ((byte)height_00 & 0x3f)) + this->transaction_count >>
                ((byte)height_00 & 0x3f)) {
      ::std::vector<bool,_std::allocator<bool>_>::vector(&local_a0,matches);
      TraverseAndBuild(this,height_00,uVar2,txids,&local_a0);
      if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
    }
  }
  return;
}

Assistant:

void MerkleBlock::TraverseAndBuild(
    uint64_t height, uint64_t pos, const std::vector<Txid>& txids,
    const std::vector<bool> matches) {
  bool has_parent_of_match = false;
  for (uint64_t index = pos << height;
       (index < ((pos + 1) << height)) && (index < transaction_count);
       ++index) {
    if (matches[index]) {
      has_parent_of_match = true;
      break;
    }
  }
  bits_.push_back(has_parent_of_match);
  if ((height == 0) || (!has_parent_of_match)) {
    // if at height 0, or nothing interesting below, store hash and stop
    txids_.push_back(CalculateHash(height, pos, txids));
  } else {
    TraverseAndBuild(height - 1, pos * 2, txids, matches);
    if ((pos * 2 + 1) < CalcTreeWidth(transaction_count, height - 1)) {
      TraverseAndBuild(height - 1, pos * 2 + 1, txids, matches);
    }
  }
}